

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall
cmCTest::HandleTestModelArgument
          (cmCTest *this,char *ctestExec,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pcVar2;
  char *__s;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  size_t sVar6;
  bool bVar7;
  string *s;
  string arg;
  ostringstream cmCTestLog_msg;
  long *local_1f0;
  long local_1e0 [2];
  long *local_1d0 [2];
  long local_1c0 [2];
  char *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1d0[0] = local_1c0;
  pcVar2 = pbVar1[*i]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,pcVar2,pcVar2 + pbVar1[*i]._M_string_length);
  iVar3 = std::__cxx11::string::compare((char *)local_1d0);
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)local_1d0);
    bVar7 = true;
    if (iVar3 != 0) goto LAB_002933f3;
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar7 = true;
  if (*i < ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
    sVar4 = *i + 1;
    *i = sVar4;
    s = pbVar1 + sVar4;
    local_1b0 = ctestExec;
    cmsys::SystemTools::LowerCase((string *)local_1a8,s);
    iVar3 = std::__cxx11::string::compare(local_1a8);
    pcVar2 = local_1a8 + 0x10;
    if ((pointer)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (iVar3 == 0) {
      this->InteractiveDebugMode = false;
      this->TestModel = 1;
    }
    else {
      cmsys::SystemTools::LowerCase((string *)local_1a8,s);
      iVar3 = std::__cxx11::string::compare(local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (iVar3 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
      }
      else {
        cmsys::SystemTools::LowerCase((string *)local_1a8,s);
        iVar3 = std::__cxx11::string::compare(local_1a8);
        if ((pointer)local_1a8._0_8_ != pcVar2) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        __s = local_1b0;
        if (iVar3 == 0) {
          this->InteractiveDebugMode = false;
          this->TestModel = 0;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"CTest -M called with incorrect option: ",0x27);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(s->_M_dataplus)._M_p,s->_M_string_length);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          Log(this,6,
              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
              ,0x88c,(char *)local_1f0,false);
          if (local_1f0 != local_1e0) {
            operator_delete(local_1f0,local_1e0[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Available options are:",0x16);
          std::ios::widen((char)(ostream *)local_1a8 +
                          (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
          std::ostream::put((char)local_1a8);
          poVar5 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
          }
          else {
            sVar6 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," -M Continuous",0xe);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          poVar5 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
          }
          else {
            sVar6 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," -M Experimental",0x10);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          poVar5 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
          }
          else {
            sVar6 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," -M Nightly",0xb);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          Log(this,6,
              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
              ,0x891,(char *)local_1f0,false);
          if (local_1f0 != local_1e0) {
            operator_delete(local_1f0,local_1e0[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          bVar7 = false;
        }
      }
    }
  }
LAB_002933f3:
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  return bVar7;
}

Assistant:

bool cmCTest::HandleTestModelArgument(const char* ctestExec, size_t& i,
                                      const std::vector<std::string>& args)
{
  bool success = true;
  std::string arg = args[i];
  if (this->CheckArgument(arg, "-M", "--test-model") &&
      (i < args.size() - 1)) {
    i++;
    std::string const& str = args[i];
    if (cmSystemTools::LowerCase(str) == "nightly") {
      this->SetTestModel(cmCTest::NIGHTLY);
    } else if (cmSystemTools::LowerCase(str) == "continuous") {
      this->SetTestModel(cmCTest::CONTINUOUS);
    } else if (cmSystemTools::LowerCase(str) == "experimental") {
      this->SetTestModel(cmCTest::EXPERIMENTAL);
    } else {
      success = false;
      cmCTestLog(this, ERROR_MESSAGE, "CTest -M called with incorrect option: "
                   << str << std::endl);
      cmCTestLog(this, ERROR_MESSAGE, "Available options are:"
                   << std::endl
                   << "  " << ctestExec << " -M Continuous" << std::endl
                   << "  " << ctestExec << " -M Experimental" << std::endl
                   << "  " << ctestExec << " -M Nightly" << std::endl);
    }
  }
  return success;
}